

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::clear(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        *this)

{
  __int_type_conflict _Var1;
  uint uVar2;
  qsbr *pqVar3;
  
  pqVar3 = qsbr::instance();
  _Var1 = (pqVar3->state).super___atomic_base<unsigned_long>._M_i;
  uVar2 = (uint)(_Var1 >> 0x20) & 0x3fffffff;
  if (uVar2 < ((uint)_Var1 & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if (uVar2 < 2) {
    delete_root_subtree(this);
    (this->root).value._M_i.tagged_ptr = 0;
    (this->current_memory_use).super___atomic_base<unsigned_long>._M_i = 0;
    (this->node_counts)._M_elems[1].super___atomic_base<unsigned_long>._M_i = 0;
    (this->node_counts)._M_elems[2].super___atomic_base<unsigned_long>._M_i = 0;
    (this->node_counts)._M_elems[3].super___atomic_base<unsigned_long>._M_i = 0;
    (this->node_counts)._M_elems[4].super___atomic_base<unsigned_long>._M_i = 0;
    return;
  }
  __assert_fail("qsbr_state::single_thread_mode(qsbr::instance().get_state())",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x671,
                "void unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::clear() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

void olc_db<Key, Value>::clear() noexcept {
  UNODB_DETAIL_ASSERT(
      qsbr_state::single_thread_mode(qsbr::instance().get_state()));

  delete_root_subtree();

  root = detail::olc_node_ptr{nullptr};

#ifdef UNODB_DETAIL_WITH_STATS
  current_memory_use.store(0, std::memory_order_relaxed);

  node_counts[as_i<node_type::I4>].store(0, std::memory_order_relaxed);
  node_counts[as_i<node_type::I16>].store(0, std::memory_order_relaxed);
  node_counts[as_i<node_type::I48>].store(0, std::memory_order_relaxed);
  node_counts[as_i<node_type::I256>].store(0, std::memory_order_relaxed);
#endif  // UNODB_DETAIL_WITH_STATS
}